

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gencnvex.c
# Opt level: O1

UBool CnvExtAddTable(NewConverter *cnvData,UCMTable *table,UConverterStaticData *staticData)

{
  short *psVar1;
  char cVar2;
  uint uVar3;
  int iVar4;
  int32_t *piVar5;
  UChar32 *pUVar6;
  UCMapping *pUVar7;
  UBool UVar8;
  uint32_t defaultValue;
  uint32_t value;
  UToolMemory *pUVar9;
  UCMapping *pUVar10;
  long lVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  ulong uVar15;
  byte bVar16;
  int *piVar17;
  int *piVar18;
  long lVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  ulong uVar25;
  
  if ((table->unicodeMask & 2) == 0) {
    staticData->conversionType = '\x02';
    pUVar10 = table->mappings;
    piVar5 = table->reverseMap;
    uVar3 = table->mappingsLength;
    uVar15 = 0;
    if (0 < (int)uVar3) {
      do {
        cVar2 = pUVar10[piVar5[uVar15]].f;
        if ((cVar2 != '\x03') && (cVar2 != '\0')) goto LAB_001da599;
        uVar15 = uVar15 + 1;
      } while (uVar3 != uVar15);
      uVar15 = (ulong)uVar3;
    }
LAB_001da599:
    iVar12 = (int)uVar15;
    if (iVar12 < (int)uVar3) {
      piVar17 = piVar5 + (uVar15 & 0xffffffff);
      uVar25 = uVar15 & 0xffffffff;
      do {
        cVar2 = pUVar10[*piVar17].f;
        if ((cVar2 == '\x03') || (cVar2 == '\0')) {
          iVar12 = (int)uVar25;
          uVar25 = (ulong)(iVar12 + 1);
          piVar5[iVar12] = *piVar17;
        }
        iVar12 = (int)uVar25;
        uVar13 = (int)uVar15 + 1;
        uVar15 = (ulong)uVar13;
        piVar17 = piVar17 + 1;
      } while ((int)uVar13 < (int)uVar3);
    }
    pUVar9 = utm_open("cnv extension toUTable",0x10000,0x1f0000,4);
    cnvData[1].isValid = (_func_UBool_NewConverter_ptr_uint8_t_ptr_int32_t *)pUVar9;
    pUVar9 = utm_open("cnv extension toUUChars",0x10000,0x40000,2);
    cnvData[1].addTable =
         (_func_UBool_NewConverter_ptr_UCMTable_ptr_UConverterStaticData_ptr *)pUVar9;
    uVar15 = 0;
    UVar8 = generateToUTable((CnvExtData *)cnvData,table,0,iVar12,0,0);
    if (UVar8 != '\0') {
      iVar12 = table->mappingsLength;
      if (0 < iVar12) {
        piVar5 = table->reverseMap;
        pUVar10 = table->mappings;
        iVar14 = 0;
        uVar15 = 0;
        do {
          bVar16 = pUVar10->f;
          if (-1 < (char)bVar16) {
            bVar16 = bVar16 & 0xf;
            pUVar10->f = bVar16;
          }
          if (((bVar16 < 2) || (bVar16 == 4)) || ((bVar16 == 2 && (pUVar10->bLen == '\x01')))) {
            iVar23 = (int)uVar15;
            uVar15 = (ulong)(iVar23 + 1);
            piVar5[iVar23] = iVar14;
            cVar2 = pUVar10->uLen;
            if (1 < (long)cVar2) {
              iVar23 = pUVar10->u;
              pUVar6 = table->codePoints;
              iVar20 = 2;
              lVar19 = 1;
              do {
                uVar3 = pUVar6[iVar23 + lVar19];
                lVar11 = (long)iVar20;
                if (uVar3 < 0x10000) {
                  iVar20 = iVar20 + 1;
                  *(ushort *)((long)pUVar6 + lVar11 * 2 + (long)iVar23 * 4) = (ushort)uVar3;
                }
                else {
                  *(short *)((long)pUVar6 + lVar11 * 2 + (long)iVar23 * 4) =
                       (short)(uVar3 >> 10) + -0x2840;
                  iVar20 = iVar20 + 2;
                  *(ushort *)((long)pUVar6 + lVar11 * 2 + (long)iVar23 * 4 + 2) =
                       (ushort)uVar3 & 0x3ff | 0xdc00;
                }
                lVar19 = lVar19 + 1;
              } while (cVar2 != lVar19);
              pUVar10->uLen = (int8_t)iVar20;
            }
          }
          pUVar10 = pUVar10 + 1;
          iVar14 = iVar14 + 1;
        } while (iVar14 != iVar12);
      }
      pUVar9 = utm_open("cnv extension fromUTableUChars",0x10000,0x1000000,2);
      cnvData[1].write =
           (_func_uint32_t_NewConverter_ptr_UConverterStaticData_ptr_UNewDataMemory_ptr_int32_t *)
           pUVar9;
      pUVar9 = utm_open("cnv extension fromUTableValues",0x10000,0x1000000,4);
      cnvData[2].close = (_func_void_NewConverter_ptr *)pUVar9;
      pUVar9 = utm_open("cnv extension fromUBytes",0x10000,0x1000000,1);
      cnvData[2].isValid = (_func_UBool_NewConverter_ptr_uint8_t_ptr_int32_t *)pUVar9;
      *(undefined8 *)((long)&cnvData[0x7002].addTable + 4) = 0x1000000040;
      *(undefined4 *)((long)&cnvData[0x5002].addTable + 4) = 0x80000001;
      *(undefined4 *)((long)&cnvData[0x7002].write + 4) = 2;
      utm_alloc((UToolMemory *)cnvData[1].write);
      utm_alloc((UToolMemory *)cnvData[2].close);
      iVar12 = (int)uVar15;
      if (iVar12 != 0) {
        pUVar7 = table->mappings;
        piVar17 = table->reverseMap;
        pUVar10 = pUVar7 + *piVar17;
        if (pUVar10->uLen != '\x01') {
          pUVar10 = (UCMapping *)(table->codePoints + pUVar10->u);
        }
        if (0 < iVar12) {
          iVar23 = pUVar10->u;
          iVar14 = 0;
          do {
            lVar19 = (long)iVar14;
            iVar21 = iVar14 + 1;
            iVar20 = iVar21;
            if (iVar21 < iVar12) {
              iVar20 = iVar12;
            }
            iVar22 = iVar20 + -1;
            iVar24 = iVar23;
            if (lVar19 + 1 < (long)uVar15) {
              piVar18 = piVar17 + lVar19 + 1;
              lVar11 = 0;
              do {
                pUVar10 = pUVar7 + *piVar18;
                if (pUVar10->uLen != '\x01') {
                  pUVar10 = (UCMapping *)(table->codePoints + pUVar10->u);
                }
                iVar24 = pUVar10->u;
                if (iVar24 != iVar23) {
                  iVar22 = iVar14 - (int)lVar11;
                  iVar20 = iVar22 + 1;
                  break;
                }
                lVar11 = lVar11 + -1;
                piVar18 = piVar18 + 1;
              } while ((1 - uVar15) + lVar19 != lVar11);
            }
            iVar4 = piVar17[lVar19];
            defaultValue = 0;
            if (pUVar7[iVar4].uLen == '\x01') {
              if ((iVar14 < iVar22) && (pUVar7[piVar17[iVar21]].uLen == '\x01')) {
                fwrite("error: multiple mappings from same Unicode code points\n",0x37,1,_stderr);
                ucm_printMapping(table,pUVar7 + iVar4,(FILE *)_stderr);
                ucm_printMapping(table,pUVar7 + piVar17[iVar21],(FILE *)_stderr);
                goto LAB_001da97a;
              }
              defaultValue = getFromUBytesValue((CnvExtData *)cnvData,table,pUVar7 + iVar4);
              iVar14 = iVar21;
            }
            if (iVar14 == iVar20) {
              addFromUTrieEntry((CnvExtData *)cnvData,iVar23,defaultValue);
            }
            else {
              value = utm_countItems((UToolMemory *)cnvData[2].close);
              addFromUTrieEntry((CnvExtData *)cnvData,iVar23,value);
              UVar8 = generateFromUTable((CnvExtData *)cnvData,table,iVar14,iVar20,2,defaultValue);
              if (UVar8 == '\0') goto LAB_001da97a;
            }
            iVar23 = iVar24;
            iVar14 = iVar20;
          } while (iVar20 < iVar12);
        }
      }
      iVar12 = *(int *)&cnvData[0x7002].addTable;
      uVar15 = 1;
      if (0 < (long)iVar12) {
        lVar19 = 0;
        do {
          psVar1 = (short *)((long)&cnvData[2].addTable + lVar19 * 2);
          *psVar1 = *psVar1 + (short)iVar12;
          lVar19 = lVar19 + 1;
        } while (iVar12 != lVar19);
      }
    }
  }
  else {
    CnvExtAddTable_cold_1();
LAB_001da97a:
    uVar15 = 0;
  }
  return (UBool)uVar15;
}

Assistant:

static UBool
CnvExtAddTable(NewConverter *cnvData, UCMTable *table, UConverterStaticData *staticData) {
    CnvExtData *extData;

    if(table->unicodeMask&UCNV_HAS_SURROGATES) {
        fprintf(stderr, "error: contains mappings for surrogate code points\n");
        return FALSE;
    }

    staticData->conversionType=UCNV_MBCS;

    extData=(CnvExtData *)cnvData;

    /*
     * assume that the table is sorted
     *
     * call the functions in this order because
     * makeToUTable() modifies the original reverseMap,
     * makeFromUTable() writes a whole new mapping into reverseMap
     */
    return
        makeToUTable(extData, table) &&
        makeFromUTable(extData, table);
}